

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void send_packet_to_downstream
               (ssh_sharing_connstate *cs,int type,void *pkt,int pktlen,share_channel *chan)

{
  unsigned_long uVar1;
  strbuf *psVar2;
  ptrlen pVar3;
  int local_b8;
  void *pvStack_a0;
  int this_len;
  void *local_98;
  void *local_80;
  ptrlen data;
  undefined1 local_68 [4];
  uint channel;
  BinarySource src [1];
  strbuf *packet;
  share_channel *chan_local;
  int pktlen_local;
  void *pkt_local;
  int type_local;
  ssh_sharing_connstate *cs_local;
  
  if (cs->sock != (Socket *)0x0) {
    if (type == 0x5e) {
      pVar3 = make_ptrlen(pkt,(long)pktlen);
      BinarySource_INIT__((BinarySource *)local_68,pVar3);
      uVar1 = BinarySource_get_uint32((BinarySource *)src[0]._24_8_);
      pVar3 = BinarySource_get_string((BinarySource *)src[0]._24_8_);
      pvStack_a0 = pVar3.ptr;
      local_80 = pvStack_a0;
      local_98 = (void *)pVar3.len;
      data.ptr = local_98;
      do {
        if ((void *)(long)chan->downstream_maxpkt < data.ptr) {
          local_b8 = chan->downstream_maxpkt;
        }
        else {
          local_b8 = (int)data.ptr;
        }
        psVar2 = strbuf_new_nm();
        BinarySink_put_uint32(psVar2->binarysink_,0);
        BinarySink_put_byte(psVar2->binarysink_,(uchar)type);
        BinarySink_put_uint32(psVar2->binarysink_,uVar1 & 0xffffffff);
        BinarySink_put_uint32(psVar2->binarysink_,(long)local_b8);
        BinarySink_put_data(psVar2->binarysink_,local_80,(long)local_b8);
        local_80 = (void *)((long)local_80 + (long)local_b8);
        data.ptr = (void *)((long)data.ptr - (long)local_b8);
        PUT_32BIT_MSB_FIRST(psVar2->s,(int)psVar2->len - 4);
        sk_write(cs->sock,psVar2->s,psVar2->len);
        strbuf_free(psVar2);
      } while (data.ptr != (void *)0x0);
    }
    else {
      psVar2 = strbuf_new_nm();
      BinarySink_put_uint32(psVar2->binarysink_,0);
      BinarySink_put_byte(psVar2->binarysink_,(uchar)type);
      BinarySink_put_data(psVar2->binarysink_,pkt,(long)pktlen);
      PUT_32BIT_MSB_FIRST(psVar2->s,(int)psVar2->len - 4);
      sk_write(cs->sock,psVar2->s,psVar2->len);
      strbuf_free(psVar2);
    }
  }
  return;
}

Assistant:

static void send_packet_to_downstream(struct ssh_sharing_connstate *cs,
                                      int type, const void *pkt, int pktlen,
                                      struct share_channel *chan)
{
    strbuf *packet;

    if (!cs->sock) /* throw away all packets destined for a dead downstream */
        return;

    if (type == SSH2_MSG_CHANNEL_DATA) {
        /*
         * Special case which we take care of at a low level, so as to
         * be sure to apply it in all cases. On rare occasions we
         * might find that we have a channel for which the
         * downstream's maximum packet size exceeds the max packet
         * size we presented to the server on its behalf. (This can
         * occur in X11 forwarding, where we have to send _our_
         * CHANNEL_OPEN_CONFIRMATION before we discover which if any
         * downstream the channel is destined for, so if that
         * downstream turns out to present a smaller max packet size
         * then we're in this situation.)
         *
         * If that happens, we just chop up the packet into pieces and
         * send them as separate CHANNEL_DATA packets.
         */
        BinarySource src[1];
        unsigned channel;
        ptrlen data;

        BinarySource_BARE_INIT(src, pkt, pktlen);
        channel = get_uint32(src);
        data = get_string(src);

        do {
            int this_len = (data.len > chan->downstream_maxpkt ?
                            chan->downstream_maxpkt : data.len);

            packet = strbuf_new_nm();
            put_uint32(packet, 0);     /* placeholder for length field */
            put_byte(packet, type);
            put_uint32(packet, channel);
            put_uint32(packet, this_len);
            put_data(packet, data.ptr, this_len);
            data.ptr = (const char *)data.ptr + this_len;
            data.len -= this_len;
            PUT_32BIT_MSB_FIRST(packet->s, packet->len-4);
            sk_write(cs->sock, packet->s, packet->len);
            strbuf_free(packet);
        } while (data.len > 0);
    } else {
        /*
         * Just do the obvious thing.
         */
        packet = strbuf_new_nm();
        put_uint32(packet, 0);     /* placeholder for length field */
        put_byte(packet, type);
        put_data(packet, pkt, pktlen);
        PUT_32BIT_MSB_FIRST(packet->s, packet->len-4);
        sk_write(cs->sock, packet->s, packet->len);
        strbuf_free(packet);
    }
}